

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateAbsStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  LogicalType *pLVar1;
  BoundFunctionExpression *pBVar2;
  vector<duckdb::BaseStatistics,_true> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  bool bVar6;
  reference stats_00;
  ulong uVar7;
  ulong uVar8;
  reference pvVar9;
  ulong value;
  ulong value_00;
  BaseStatistics stats;
  Value new_max;
  Value new_min;
  BaseStatistics local_180;
  LogicalType local_128;
  LogicalType local_110;
  LogicalType local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pBVar2 = input->expr;
  this_00 = input->child_stats;
  stats_00 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&local_70,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  LogicalType::LogicalType(&local_e0,SQLNULL);
  Value::Value(&local_b0,&local_e0);
  LogicalType::~LogicalType(&local_e0);
  bVar6 = NumericStats::HasMinMax(stats_00);
  if (bVar6) {
    switch((pBVar2->super_Expression).return_type.physical_type_) {
    case INT8:
      NumericStats::Min((Value *)&local_180,stats_00);
      Value::GetValue<signed_char>((Value *)&local_180);
      break;
    default:
      *(undefined8 *)this = 0;
      goto LAB_00fdce3c;
    case INT16:
      NumericStats::Min((Value *)&local_180,stats_00);
      Value::GetValue<short>((Value *)&local_180);
      break;
    case INT32:
      NumericStats::Min((Value *)&local_180,stats_00);
      Value::GetValue<int>((Value *)&local_180);
      break;
    case INT64:
      NumericStats::Min((Value *)&local_180,stats_00);
      Value::GetValue<long>((Value *)&local_180);
    }
    Value::~Value((Value *)&local_180);
    NumericStats::Min((Value *)&local_180,stats_00);
    uVar7 = Value::GetValue<long>((Value *)&local_180);
    Value::~Value((Value *)&local_180);
    NumericStats::Max((Value *)&local_180,stats_00);
    uVar8 = Value::GetValue<long>((Value *)&local_180);
    Value::~Value((Value *)&local_180);
    if ((long)(uVar8 & uVar7) < 0) {
      value = -uVar8;
      if (0 < (long)uVar8) {
        value = uVar8;
      }
      value_00 = -uVar7;
      if (0 < (long)uVar7) {
        value_00 = uVar7;
      }
    }
    else {
      if (-1 < (long)uVar7) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](&input->expr->children,0);
        puVar3 = input->expr_ptr;
        _Var4._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var5._M_head_impl =
             (puVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
        if (_Var5._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
        }
        vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
        BaseStatistics::ToUnique((BaseStatistics *)this);
        goto LAB_00fdce3c;
      }
      value_00 = -uVar7;
      if (-uVar8 == uVar7 || (long)-uVar7 < (long)uVar8) {
        value_00 = uVar8;
      }
      value = 0;
    }
    pLVar1 = &(pBVar2->super_Expression).return_type;
    Value::Numeric((Value *)&local_180,pLVar1,value);
    Value::operator=(&local_70,(Value *)&local_180);
    Value::~Value((Value *)&local_180);
    Value::Numeric((Value *)&local_180,pLVar1,value_00);
    Value::operator=(&local_b0,(Value *)&local_180);
    Value::~Value((Value *)&local_180);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_180,pLVar1);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&(pBVar2->function).function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_180);
    if (local_180.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_180.type.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)(&local_180,&local_180,3);
    }
  }
  else {
    pLVar1 = &(pBVar2->super_Expression).return_type;
    LogicalType::LogicalType(&local_f8,pLVar1);
    Value::Value((Value *)&local_180,&local_f8);
    Value::operator=(&local_70,(Value *)&local_180);
    Value::~Value((Value *)&local_180);
    LogicalType::~LogicalType(&local_f8);
    LogicalType::LogicalType(&local_110,pLVar1);
    Value::Value((Value *)&local_180,&local_110);
    Value::operator=(&local_b0,(Value *)&local_180);
    Value::~Value((Value *)&local_180);
    LogicalType::~LogicalType(&local_110);
  }
  LogicalType::LogicalType(&local_128,&(pBVar2->super_Expression).return_type);
  NumericStats::CreateEmpty(&local_180,&local_128);
  LogicalType::~LogicalType(&local_128);
  NumericStats::SetMin(&local_180,&local_70);
  NumericStats::SetMax(&local_180,&local_b0);
  BaseStatistics::CopyValidity(&local_180,stats_00);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_180);
LAB_00fdce3c:
  Value::~Value(&local_b0);
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateAbsStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 1);
	// can only propagate stats if the children have stats
	auto &lstats = child_stats[0];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(lstats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow = NumericStats::Min(lstats).GetValue<int8_t>() == NumericLimits<int8_t>::Minimum();
			break;
		case PhysicalType::INT16:
			potential_overflow = NumericStats::Min(lstats).GetValue<int16_t>() == NumericLimits<int16_t>::Minimum();
			break;
		case PhysicalType::INT32:
			potential_overflow = NumericStats::Min(lstats).GetValue<int32_t>() == NumericLimits<int32_t>::Minimum();
			break;
		case PhysicalType::INT64:
			potential_overflow = NumericStats::Min(lstats).GetValue<int64_t>() == NumericLimits<int64_t>::Minimum();
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	} else {
		// no potential overflow

		// compute stats
		auto current_min = NumericStats::Min(lstats).GetValue<int64_t>();
		auto current_max = NumericStats::Max(lstats).GetValue<int64_t>();

		int64_t min_val, max_val;

		if (current_min < 0 && current_max < 0) {
			// if both min and max are below zero, then min=abs(cur_max) and max=abs(cur_min)
			min_val = AbsValue(current_max);
			max_val = AbsValue(current_min);
		} else if (current_min < 0) {
			D_ASSERT(current_max >= 0);
			// if min is below zero and max is above 0, then min=0 and max=max(cur_max, abs(cur_min))
			min_val = 0;
			max_val = MaxValue(AbsValue(current_min), current_max);
		} else {
			// if both current_min and current_max are > 0, then the abs is a no-op and can be removed entirely
			*input.expr_ptr = std::move(input.expr.children[0]);
			return child_stats[0].ToUnique();
		}
		new_min = Value::Numeric(expr.return_type, min_val);
		new_max = Value::Numeric(expr.return_type, max_val);
		expr.function.function = ScalarFunction::GetScalarUnaryFunction<AbsOperator>(expr.return_type);
	}
	auto stats = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(stats, new_min);
	NumericStats::SetMax(stats, new_max);
	stats.CopyValidity(lstats);
	return stats.ToUnique();
}